

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

void N_VLinearSum_Serial(sunrealtype a,N_Vector x,sunrealtype b,N_Vector y,N_Vector z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  N_Vector in_RDX;
  N_Vector in_RSI;
  N_Vector in_RDI;
  sunrealtype in_XMM0_Qa;
  double in_XMM1_Qa;
  int test;
  N_Vector v2;
  N_Vector v1;
  sunrealtype *zd;
  sunrealtype *yd;
  sunrealtype *xd;
  sunrealtype c;
  sunindextype N;
  sunindextype i;
  N_Vector local_b0;
  N_Vector local_98;
  N_Vector local_80;
  long local_30;
  
  if (((in_XMM1_Qa != 1.0) || (NAN(in_XMM1_Qa))) || (in_RDX != in_RSI)) {
    if (((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) || (in_RDX != in_RDI)) {
      if (((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) || ((in_XMM1_Qa != 1.0 || (NAN(in_XMM1_Qa)))))
      {
        bVar5 = false;
        if ((in_XMM0_Qa == 1.0) && (!NAN(in_XMM0_Qa))) {
          bVar5 = in_XMM1_Qa == -1.0;
        }
        if ((bVar5) ||
           ((((in_XMM0_Qa == -1.0 && (!NAN(in_XMM0_Qa))) && (in_XMM1_Qa == 1.0)) &&
            (!NAN(in_XMM1_Qa))))) {
          local_80 = in_RSI;
          if (bVar5) {
            local_80 = in_RDI;
            in_RDI = in_RSI;
          }
          VDiff_Serial(local_80,in_RDI,in_RDX);
        }
        else if ((in_XMM0_Qa == 1.0) || ((in_XMM1_Qa == 1.0 && (!NAN(in_XMM1_Qa))))) {
          local_98 = in_RSI;
          if (in_XMM0_Qa == 1.0) {
            local_98 = in_RDI;
            in_XMM0_Qa = in_XMM1_Qa;
            in_RDI = in_RSI;
          }
          VLin1_Serial(in_XMM0_Qa,in_RDI,local_98,in_RDX);
        }
        else if ((in_XMM0_Qa == -1.0) || ((in_XMM1_Qa == -1.0 && (!NAN(in_XMM1_Qa))))) {
          local_b0 = in_RSI;
          if (in_XMM0_Qa == -1.0) {
            local_b0 = in_RDI;
            in_XMM0_Qa = in_XMM1_Qa;
            in_RDI = in_RSI;
          }
          VLin2_Serial(in_XMM0_Qa,in_RDI,local_b0,in_RDX);
        }
        else if ((in_XMM0_Qa != in_XMM1_Qa) || (NAN(in_XMM0_Qa) || NAN(in_XMM1_Qa))) {
          if ((in_XMM0_Qa != -in_XMM1_Qa) || (NAN(in_XMM0_Qa) || NAN(-in_XMM1_Qa))) {
            lVar1 = *in_RDI->content;
            lVar2 = *(long *)((long)in_RDI->content + 0x10);
            lVar3 = *(long *)((long)in_RSI->content + 0x10);
            lVar4 = *(long *)((long)in_RDX->content + 0x10);
            for (local_30 = 0; local_30 < lVar1; local_30 = local_30 + 1) {
              *(double *)(lVar4 + local_30 * 8) =
                   in_XMM0_Qa * *(double *)(lVar2 + local_30 * 8) +
                   in_XMM1_Qa * *(double *)(lVar3 + local_30 * 8);
            }
          }
          else {
            VScaleDiff_Serial(in_XMM0_Qa,in_RDI,in_RSI,in_RDX);
          }
        }
        else {
          VScaleSum_Serial(in_XMM0_Qa,in_RDI,in_RSI,in_RDX);
        }
      }
      else {
        VSum_Serial(in_RDI,in_RSI,in_RDX);
      }
    }
    else {
      Vaxpy_Serial(in_XMM1_Qa,in_RSI,in_RDI);
    }
  }
  else {
    Vaxpy_Serial(in_XMM0_Qa,in_RDI,in_RSI);
  }
  return;
}

Assistant:

void N_VLinearSum_Serial(sunrealtype a, N_Vector x, sunrealtype b, N_Vector y,
                         N_Vector z)
{
  sunindextype i, N;
  sunrealtype c, *xd, *yd, *zd;
  N_Vector v1, v2;
  sunbooleantype test;

  xd = yd = zd = NULL;

  if ((b == ONE) && (z == y))
  { /* BLAS usage: axpy y <- ax+y */
    Vaxpy_Serial(a, x, y);
    return;
  }

  if ((a == ONE) && (z == x))
  { /* BLAS usage: axpy x <- by+x */
    Vaxpy_Serial(b, y, x);
    return;
  }

  /* Case: a == b == 1.0 */

  if ((a == ONE) && (b == ONE))
  {
    VSum_Serial(x, y, z);
    return;
  }

  /* Cases: (1) a == 1.0, b = -1.0, (2) a == -1.0, b == 1.0 */

  if ((test = ((a == ONE) && (b == -ONE))) || ((a == -ONE) && (b == ONE)))
  {
    v1 = test ? y : x;
    v2 = test ? x : y;
    VDiff_Serial(v2, v1, z);
    return;
  }

  /* Cases: (1) a == 1.0, b == other or 0.0, (2) a == other or 0.0, b == 1.0 */
  /* if a or b is 0.0, then user should have called N_VScale */

  if ((test = (a == ONE)) || (b == ONE))
  {
    c  = test ? b : a;
    v1 = test ? y : x;
    v2 = test ? x : y;
    VLin1_Serial(c, v1, v2, z);
    return;
  }

  /* Cases: (1) a == -1.0, b != 1.0, (2) a != 1.0, b == -1.0 */

  if ((test = (a == -ONE)) || (b == -ONE))
  {
    c  = test ? b : a;
    v1 = test ? y : x;
    v2 = test ? x : y;
    VLin2_Serial(c, v1, v2, z);
    return;
  }

  /* Case: a == b */
  /* catches case both a and b are 0.0 - user should have called N_VConst */

  if (a == b)
  {
    VScaleSum_Serial(a, x, y, z);
    return;
  }

  /* Case: a == -b */

  if (a == -b)
  {
    VScaleDiff_Serial(a, x, y, z);
    return;
  }

  /* Do all cases not handled above:
     (1) a == other, b == 0.0 - user should have called N_VScale
     (2) a == 0.0, b == other - user should have called N_VScale
     (3) a,b == other, a !=b, a != -b */

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  yd = NV_DATA_S(y);
  zd = NV_DATA_S(z);

  for (i = 0; i < N; i++) { zd[i] = (a * xd[i]) + (b * yd[i]); }

  return;
}